

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O1

void remove_tractor_beam_from_both_ships(Am_Object *beam)

{
  Am_Value *pAVar1;
  char cVar2;
  Am_Object ship;
  Am_Object AStack_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)beam,(ulong)TB_SOURCE);
  Am_Object::Am_Object(&AStack_38,pAVar1);
  cVar2 = Am_Object::Valid();
  if (cVar2 != '\0') {
    Am_Object::Am_Object(&local_18,beam);
    Am_Object::Am_Object(&local_20,&AStack_38);
    remove_tractor_beam_from_ship(&local_18,&local_20);
    Am_Object::~Am_Object(&local_20);
    Am_Object::~Am_Object(&local_18);
  }
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)beam,(ulong)TB_DEST);
  Am_Object::operator=(&AStack_38,pAVar1);
  cVar2 = Am_Object::Valid();
  if (cVar2 != '\0') {
    Am_Object::Am_Object(&local_28,beam);
    Am_Object::Am_Object(&local_30,&AStack_38);
    remove_tractor_beam_from_ship(&local_28,&local_30);
    Am_Object::~Am_Object(&local_30);
    Am_Object::~Am_Object(&local_28);
  }
  Am_Object::~Am_Object(&AStack_38);
  return;
}

Assistant:

void
remove_tractor_beam_from_both_ships(Am_Object beam)
{
  Am_Object ship = (Am_Object)(beam.Get(TB_SOURCE));
  if (ship.Valid())
    remove_tractor_beam_from_ship(beam, ship);
  ship = beam.Get(TB_DEST);
  if (ship.Valid())
    remove_tractor_beam_from_ship(beam, ship);
}